

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Scale_x86_avx::forward_inplace
          (Scale_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  Mat *this_00;
  void *pvVar7;
  long lVar8;
  _func_int **pp_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 in_ZMM2 [64];
  float *scale_ptr;
  Mat local_78;
  
  this_00 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar28 = this_00->dims;
  if (this_00->elempack == 4) {
    if (iVar28 == 3) {
      uVar32 = this_00->h * this_00->w;
      uVar29 = this_00->c;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar34);
          pauVar35 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x10);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar38._0_4_ = fVar5 * *(float *)*pauVar35;
            auVar38._4_4_ = fVar6 * *(float *)(*pauVar35 + 4);
            auVar38._8_4_ = fVar10 * *(float *)(*pauVar35 + 8);
            auVar38._12_4_ = fVar11 * *(float *)(*pauVar35 + 0xc);
            *(undefined1 (*) [16])*pauVar35 = auVar38;
            pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
          }
        }
      }
      else {
        uVar34 = 0;
        uVar31 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          Mat::channel(&local_78,this_00,(int)uVar34);
          pauVar35 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x10);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          pfVar1 = (float *)(*(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx[-3]) +
                            uVar34 * 0x10);
          fVar12 = *pfVar1;
          fVar13 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar43._0_4_ = fVar5 * *(float *)*pauVar35 + fVar12;
            auVar43._4_4_ = fVar6 * *(float *)(*pauVar35 + 4) + fVar13;
            auVar43._8_4_ = fVar10 * *(float *)(*pauVar35 + 8) + fVar14;
            auVar43._12_4_ = fVar11 * *(float *)(*pauVar35 + 0xc) + fVar15;
            *(undefined1 (*) [16])*pauVar35 = auVar43;
            pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
          }
        }
      }
    }
    else if (iVar28 == 2) {
      pp_Var9 = this->_vptr_Scale_x86_avx;
      uVar29 = this_00->w;
      uVar32 = this_00->h;
      if (*(int *)(&this->field_0xd4 + (long)pp_Var9[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          pauVar36 = (undefined1 (*) [16])
                     ((long)this_00->w * uVar34 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x10);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar37._0_4_ = fVar5 * *(float *)*pauVar36;
            auVar37._4_4_ = fVar6 * *(float *)((long)*pauVar36 + 4);
            auVar37._8_4_ = fVar10 * *(float *)((long)*pauVar36 + 8);
            auVar37._12_4_ = fVar11 * *(float *)((long)*pauVar36 + 0xc);
            *pauVar36 = auVar37;
            pauVar36 = pauVar36 + 1;
          }
        }
      }
      else {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          pauVar36 = (undefined1 (*) [16])
                     ((long)this_00->w * uVar34 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x10);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          pfVar1 = (float *)(*(long *)(&this->field_0x120 + (long)pp_Var9[-3]) + uVar34 * 0x10);
          fVar12 = *pfVar1;
          fVar13 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar42._0_4_ = fVar5 * *(float *)*pauVar36 + fVar12;
            auVar42._4_4_ = fVar6 * *(float *)((long)*pauVar36 + 4) + fVar13;
            auVar42._8_4_ = fVar10 * *(float *)((long)*pauVar36 + 8) + fVar14;
            auVar42._12_4_ = fVar11 * *(float *)((long)*pauVar36 + 0xc) + fVar15;
            *pauVar36 = auVar42;
            pauVar36 = pauVar36 + 1;
          }
        }
      }
    }
    else if (iVar28 == 1) {
      uVar29 = this_00->w;
      pvVar7 = this_00[1].data;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        for (; uVar31 * 0x10 != uVar34; uVar34 = uVar34 + 0x10) {
          pfVar1 = (float *)((long)pvVar7 + uVar34);
          fVar5 = pfVar1[1];
          fVar6 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar2 = (float *)((long)this_00->data + uVar34);
          fVar11 = pfVar2[1];
          fVar12 = pfVar2[2];
          fVar13 = pfVar2[3];
          pfVar3 = (float *)((long)this_00->data + uVar34);
          *pfVar3 = *pfVar1 * *pfVar2;
          pfVar3[1] = fVar5 * fVar11;
          pfVar3[2] = fVar6 * fVar12;
          pfVar3[3] = fVar10 * fVar13;
        }
      }
      else {
        lVar8 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx[-3]);
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        for (; uVar31 * 0x10 != uVar34; uVar34 = uVar34 + 0x10) {
          pfVar1 = (float *)((long)pvVar7 + uVar34);
          fVar5 = pfVar1[1];
          fVar6 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar2 = (float *)((long)this_00->data + uVar34);
          fVar11 = pfVar2[1];
          fVar12 = pfVar2[2];
          fVar13 = pfVar2[3];
          pfVar3 = (float *)(lVar8 + uVar34);
          fVar14 = pfVar3[1];
          fVar15 = pfVar3[2];
          fVar16 = pfVar3[3];
          pfVar4 = (float *)((long)this_00->data + uVar34);
          *pfVar4 = *pfVar1 * *pfVar2 + *pfVar3;
          pfVar4[1] = fVar5 * fVar11 + fVar14;
          pfVar4[2] = fVar6 * fVar12 + fVar15;
          pfVar4[3] = fVar10 * fVar13 + fVar16;
        }
      }
    }
  }
  else if (this_00->elempack == 8) {
    if (iVar28 == 3) {
      uVar32 = this_00->h * this_00->w;
      uVar29 = this_00->c;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          Mat::channel(&local_78,this_00,(int)uVar34);
          pauVar35 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x20);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar41._0_4_ = fVar5 * *(float *)*pauVar35;
            auVar41._4_4_ = fVar6 * *(float *)(*pauVar35 + 4);
            auVar41._8_4_ = fVar10 * *(float *)(*pauVar35 + 8);
            auVar41._12_4_ = fVar11 * *(float *)(*pauVar35 + 0xc);
            auVar41._16_4_ = fVar12 * *(float *)(*pauVar35 + 0x10);
            auVar41._20_4_ = fVar13 * *(float *)(*pauVar35 + 0x14);
            auVar41._28_36_ = in_ZMM1._28_36_;
            auVar41._24_4_ = fVar14 * *(float *)(*pauVar35 + 0x18);
            in_ZMM1 = ZEXT3264(auVar41._0_32_);
            *pauVar35 = auVar41._0_32_;
            pauVar35 = pauVar35 + 1;
          }
        }
      }
      else {
        uVar34 = 0;
        uVar31 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
          Mat::channel(&local_78,this_00,(int)uVar34);
          pauVar35 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x20);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          pfVar1 = (float *)(*(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx[-3]) +
                            uVar34 * 0x20);
          fVar15 = *pfVar1;
          fVar16 = pfVar1[1];
          fVar17 = pfVar1[2];
          fVar18 = pfVar1[3];
          fVar19 = pfVar1[4];
          fVar20 = pfVar1[5];
          fVar21 = pfVar1[6];
          fVar22 = pfVar1[7];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar46._0_4_ = fVar5 * *(float *)*pauVar35 + fVar15;
            auVar46._4_4_ = fVar6 * *(float *)(*pauVar35 + 4) + fVar16;
            auVar46._8_4_ = fVar10 * *(float *)(*pauVar35 + 8) + fVar17;
            auVar46._12_4_ = fVar11 * *(float *)(*pauVar35 + 0xc) + fVar18;
            auVar46._16_4_ = fVar12 * *(float *)(*pauVar35 + 0x10) + fVar19;
            auVar46._20_4_ = fVar13 * *(float *)(*pauVar35 + 0x14) + fVar20;
            auVar46._24_4_ = fVar14 * *(float *)(*pauVar35 + 0x18) + fVar21;
            auVar46._28_4_ = in_ZMM2._28_4_ + fVar22;
            in_ZMM2 = ZEXT3264(auVar46);
            *pauVar35 = auVar46;
            pauVar35 = pauVar35 + 1;
          }
        }
      }
    }
    else if (iVar28 == 2) {
      pp_Var9 = this->_vptr_Scale_x86_avx;
      uVar29 = this_00->w;
      uVar32 = this_00->h;
      if (*(int *)(&this->field_0xd4 + (long)pp_Var9[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          pauVar35 = (undefined1 (*) [32])
                     ((long)this_00->w * uVar34 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x20);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar40._0_4_ = fVar5 * *(float *)*pauVar35;
            auVar40._4_4_ = fVar6 * *(float *)((long)*pauVar35 + 4);
            auVar40._8_4_ = fVar10 * *(float *)((long)*pauVar35 + 8);
            auVar40._12_4_ = fVar11 * *(float *)((long)*pauVar35 + 0xc);
            auVar40._16_4_ = fVar12 * *(float *)((long)*pauVar35 + 0x10);
            auVar40._20_4_ = fVar13 * *(float *)((long)*pauVar35 + 0x14);
            auVar40._28_36_ = in_ZMM1._28_36_;
            auVar40._24_4_ = fVar14 * *(float *)((long)*pauVar35 + 0x18);
            in_ZMM1 = ZEXT3264(auVar40._0_32_);
            *pauVar35 = auVar40._0_32_;
            pauVar35 = pauVar35 + 1;
          }
        }
      }
      else {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        uVar33 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          uVar33 = uVar34;
        }
        for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
          pauVar35 = (undefined1 (*) [32])
                     ((long)this_00->w * uVar34 * this_00->elemsize + (long)this_00->data);
          pfVar1 = (float *)((long)this_00[1].data + uVar34 * 0x20);
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          fVar12 = pfVar1[4];
          fVar13 = pfVar1[5];
          fVar14 = pfVar1[6];
          pfVar1 = (float *)(*(long *)(&this->field_0x120 + (long)pp_Var9[-3]) + uVar34 * 0x20);
          fVar15 = *pfVar1;
          fVar16 = pfVar1[1];
          fVar17 = pfVar1[2];
          fVar18 = pfVar1[3];
          fVar19 = pfVar1[4];
          fVar20 = pfVar1[5];
          fVar21 = pfVar1[6];
          fVar22 = pfVar1[7];
          uVar30 = uVar31;
          while (iVar28 = (int)uVar30, uVar30 = (ulong)(iVar28 - 1), iVar28 != 0) {
            auVar45._0_4_ = fVar5 * *(float *)*pauVar35 + fVar15;
            auVar45._4_4_ = fVar6 * *(float *)((long)*pauVar35 + 4) + fVar16;
            auVar45._8_4_ = fVar10 * *(float *)((long)*pauVar35 + 8) + fVar17;
            auVar45._12_4_ = fVar11 * *(float *)((long)*pauVar35 + 0xc) + fVar18;
            auVar45._16_4_ = fVar12 * *(float *)((long)*pauVar35 + 0x10) + fVar19;
            auVar45._20_4_ = fVar13 * *(float *)((long)*pauVar35 + 0x14) + fVar20;
            auVar45._24_4_ = fVar14 * *(float *)((long)*pauVar35 + 0x18) + fVar21;
            auVar45._28_4_ = in_ZMM2._28_4_ + fVar22;
            in_ZMM2 = ZEXT3264(auVar45);
            *pauVar35 = auVar45;
            pauVar35 = pauVar35 + 1;
          }
        }
      }
    }
    else if (iVar28 == 1) {
      uVar29 = this_00->w;
      pvVar7 = this_00[1].data;
      if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx[-3]) == 0) {
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        for (; uVar31 * 0x20 != uVar34; uVar34 = uVar34 + 0x20) {
          pfVar1 = (float *)((long)pvVar7 + uVar34);
          fVar5 = pfVar1[1];
          fVar6 = pfVar1[2];
          fVar10 = pfVar1[3];
          fVar11 = pfVar1[4];
          fVar12 = pfVar1[5];
          fVar13 = pfVar1[6];
          fVar14 = pfVar1[7];
          pfVar2 = (float *)((long)this_00->data + uVar34);
          fVar15 = pfVar2[1];
          fVar16 = pfVar2[2];
          fVar17 = pfVar2[3];
          fVar18 = pfVar2[4];
          fVar19 = pfVar2[5];
          fVar20 = pfVar2[6];
          pfVar3 = (float *)((long)this_00->data + uVar34);
          *pfVar3 = *pfVar1 * *pfVar2;
          pfVar3[1] = fVar5 * fVar15;
          pfVar3[2] = fVar6 * fVar16;
          pfVar3[3] = fVar10 * fVar17;
          pfVar3[4] = fVar11 * fVar18;
          pfVar3[5] = fVar12 * fVar19;
          pfVar3[6] = fVar13 * fVar20;
          pfVar3[7] = fVar14;
        }
      }
      else {
        lVar8 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx[-3]);
        uVar34 = 0;
        uVar31 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar31 = uVar34;
        }
        for (; uVar31 * 0x20 != uVar34; uVar34 = uVar34 + 0x20) {
          pfVar1 = (float *)((long)pvVar7 + uVar34);
          fVar5 = pfVar1[1];
          fVar6 = pfVar1[2];
          fVar10 = pfVar1[3];
          fVar11 = pfVar1[4];
          fVar12 = pfVar1[5];
          fVar13 = pfVar1[6];
          fVar14 = pfVar1[7];
          pfVar2 = (float *)((long)this_00->data + uVar34);
          fVar15 = pfVar2[1];
          fVar16 = pfVar2[2];
          fVar17 = pfVar2[3];
          fVar18 = pfVar2[4];
          fVar19 = pfVar2[5];
          fVar20 = pfVar2[6];
          pfVar3 = (float *)(lVar8 + uVar34);
          fVar21 = pfVar3[1];
          fVar22 = pfVar3[2];
          fVar23 = pfVar3[3];
          fVar24 = pfVar3[4];
          fVar25 = pfVar3[5];
          fVar26 = pfVar3[6];
          fVar27 = pfVar3[7];
          pfVar4 = (float *)((long)this_00->data + uVar34);
          *pfVar4 = *pfVar1 * *pfVar2 + *pfVar3;
          pfVar4[1] = fVar5 * fVar15 + fVar21;
          pfVar4[2] = fVar6 * fVar16 + fVar22;
          pfVar4[3] = fVar10 * fVar17 + fVar23;
          pfVar4[4] = fVar11 * fVar18 + fVar24;
          pfVar4[5] = fVar12 * fVar19 + fVar25;
          pfVar4[6] = fVar13 * fVar20 + fVar26;
          pfVar4[7] = fVar14 + fVar27;
        }
      }
    }
  }
  else {
    if (iVar28 != 3) {
      iVar28 = Scale::forward_inplace
                         ((Scale *)((long)&this->_vptr_Scale_x86_avx +
                                   (long)this->_vptr_Scale_x86_avx[-3]),bottom_top_blobs,opt);
      return iVar28;
    }
    uVar29 = this_00->c;
    uVar32 = this_00->h * this_00->w;
    pvVar7 = this_00[1].data;
    if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Scale_x86_avx[-3]) == 0) {
      uVar34 = 0;
      uVar31 = (ulong)uVar29;
      if ((int)uVar29 < 1) {
        uVar31 = uVar34;
      }
      for (; uVar34 != uVar31; uVar34 = uVar34 + 1) {
        in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
        Mat::channel(&local_78,this_00,(int)uVar34);
        pauVar35 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        fVar5 = *(float *)((long)pvVar7 + uVar34 * 4);
        for (iVar28 = (int)uVar32 >> 3; uVar29 = uVar32 & 7, 0 < iVar28; iVar28 = iVar28 + -1) {
          auVar39._0_4_ = fVar5 * *(float *)*pauVar35;
          auVar39._4_4_ = fVar5 * *(float *)(*pauVar35 + 4);
          auVar39._8_4_ = fVar5 * *(float *)(*pauVar35 + 8);
          auVar39._12_4_ = fVar5 * *(float *)(*pauVar35 + 0xc);
          auVar39._16_4_ = fVar5 * *(float *)(*pauVar35 + 0x10);
          auVar39._20_4_ = fVar5 * *(float *)(*pauVar35 + 0x14);
          auVar39._28_36_ = in_ZMM1._28_36_;
          auVar39._24_4_ = fVar5 * *(float *)(*pauVar35 + 0x18);
          in_ZMM1 = ZEXT3264(auVar39._0_32_);
          *pauVar35 = auVar39._0_32_;
          pauVar35 = pauVar35 + 1;
        }
        for (; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
          fVar6 = fVar5 * *(float *)*pauVar35;
          in_ZMM1 = ZEXT464((uint)fVar6);
          *(float *)*pauVar35 = fVar6;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + 4);
        }
      }
    }
    else {
      lVar8 = *(long *)(&this->field_0x120 + (long)this->_vptr_Scale_x86_avx[-3]);
      uVar34 = 0;
      uVar31 = (ulong)uVar29;
      if ((int)uVar29 < 1) {
        uVar31 = uVar34;
      }
      for (; uVar34 != uVar31; uVar34 = uVar34 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        Mat::channel(&local_78,this_00,(int)uVar34);
        pauVar35 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        fVar5 = *(float *)((long)pvVar7 + uVar34 * 4);
        fVar6 = *(float *)(lVar8 + uVar34 * 4);
        for (iVar28 = (int)uVar32 >> 3; uVar29 = uVar32 & 7, 0 < iVar28; iVar28 = iVar28 + -1) {
          auVar44._0_4_ = fVar5 * *(float *)*pauVar35 + fVar6;
          auVar44._4_4_ = fVar5 * *(float *)(*pauVar35 + 4) + fVar6;
          auVar44._8_4_ = fVar5 * *(float *)(*pauVar35 + 8) + fVar6;
          auVar44._12_4_ = fVar5 * *(float *)(*pauVar35 + 0xc) + fVar6;
          auVar44._16_4_ = fVar5 * *(float *)(*pauVar35 + 0x10) + fVar6;
          auVar44._20_4_ = fVar5 * *(float *)(*pauVar35 + 0x14) + fVar6;
          auVar44._24_4_ = fVar5 * *(float *)(*pauVar35 + 0x18) + fVar6;
          auVar44._28_4_ = in_ZMM2._28_4_ + fVar6;
          in_ZMM2 = ZEXT3264(auVar44);
          *pauVar35 = auVar44;
          pauVar35 = pauVar35 + 1;
        }
        for (; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
          fVar10 = fVar5 * *(float *)*pauVar35 + fVar6;
          in_ZMM2 = ZEXT464((uint)fVar10);
          *(float *)*pauVar35 = fVar10;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_avx::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}